

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall
llvm::detail::IEEEFloat::toString
          (IEEEFloat *this,SmallVectorImpl<char> *Str,uint FormatPrecision,uint FormatMaxPadding,
          bool TruncateZero)

{
  byte bVar1;
  short sVar2;
  SmallVectorImpl<char> *pSVar3;
  bool bVar4;
  uint uVar5;
  uint64_t uVar6;
  int iVar7;
  char *pcVar8;
  Significand *pSVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 uVar15;
  char *pcVar16;
  undefined3 in_register_00000081;
  bool bVar17;
  double __x;
  ArrayRef<unsigned_long> bigVal;
  byte local_1a9;
  uint local_1a8;
  undefined4 local_1a4;
  APInt powten;
  undefined1 local_190 [8];
  SmallVectorImpl<char> *local_188;
  ulong local_180;
  APInt significand;
  ulong local_168;
  APInt ten;
  APInt digit;
  SmallVector<char,_256U> buffer;
  
  uVar13 = (ulong)FormatPrecision;
  bVar1 = this->field_0x12;
  if ((bVar1 & 7) == 3) {
    if ((bVar1 & 8) != 0) {
      buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX =
           (void *)CONCAT71(buffer.super_SmallVectorImpl<char>.
                            super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                            ._1_7_,0x2d);
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&buffer);
    }
    if (FormatMaxPadding != 0) {
      buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX =
           (void *)CONCAT71(buffer.super_SmallVectorImpl<char>.
                            super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                            ._1_7_,0x30);
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&buffer);
      return;
    }
    if (TruncateZero) {
      pcVar16 = "0.0E+0";
      pcVar8 = "";
    }
    else {
      SmallVectorImpl<char>::append<char_const*,void>(Str,"0.0","");
      if (1 < FormatPrecision) {
        buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX =
             (void *)CONCAT71(buffer.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX._1_7_,0x30);
        SmallVectorImpl<char>::append(Str,(ulong)(FormatPrecision - 1),(char *)&buffer);
      }
      pcVar16 = "e+00";
      pcVar8 = "";
    }
    SmallVectorImpl<char>::append<char_const*,void>(Str,pcVar16,pcVar8);
    return;
  }
  if ((bVar1 & 7) == 1) {
    pcVar16 = "NaN";
    pcVar8 = "";
LAB_0016189f:
    SmallVectorImpl<char>::append<char_const*,void>(Str,pcVar16,pcVar8);
    return;
  }
  if ((bVar1 & 7) == 0) {
    if ((bVar1 & 8) == 0) {
      pcVar16 = "+Inf";
      pcVar8 = "";
    }
    else {
      pcVar16 = "-Inf";
      pcVar8 = "";
    }
    goto LAB_0016189f;
  }
  local_1a8 = FormatMaxPadding;
  if ((bVar1 & 8) != 0) {
    buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX =
         (void *)CONCAT71(buffer.super_SmallVectorImpl<char>.
                          super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX.
                          _1_7_,0x2d);
    SmallVectorTemplateBase<char,_true>::push_back
              (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&buffer);
  }
  uVar11 = this->semantics->precision;
  if (uVar11 - 0x40 < 0xffffff80) {
    pSVar9 = (Significand *)(this->significand).part;
  }
  else {
    pSVar9 = &this->significand;
  }
  sVar2 = this->exponent;
  bigVal.Length._0_4_ = uVar11 + 0x3f >> 6;
  bigVal.Data = (unsigned_long *)pSVar9;
  bigVal.Length._4_4_ = 0;
  local_1a4 = CONCAT31(in_register_00000081,TruncateZero);
  APInt::APInt(&significand,uVar11,bigVal);
  if (FormatPrecision == 0) {
    uVar13 = (ulong)((this->semantics->precision * 0x3b) / 0xc4 + 2);
  }
  uVar5 = APInt::countTrailingZeros(&significand);
  APInt::lshrInPlace(&significand,uVar5);
  uVar11 = ((int)sVar2 - uVar11) + uVar5 + 1;
  local_188 = Str;
  local_180 = uVar13;
  if (uVar11 == 0) {
LAB_00161962:
    local_168 = 0;
  }
  else {
    if (0 < (int)uVar11) {
      APInt::zext((APInt *)&buffer,(uint)&significand);
      APInt::operator=(&significand,(APInt *)&buffer);
      APInt::~APInt((APInt *)&buffer);
      APInt::operator<<=(&significand,uVar11);
      goto LAB_00161962;
    }
    uVar12 = -uVar11;
    uVar5 = this->semantics->precision;
    APInt::zext((APInt *)&buffer,(uint)&significand);
    APInt::operator=(&significand,(APInt *)&buffer);
    APInt::~APInt((APInt *)&buffer);
    uVar13 = local_180;
    APInt::APInt((APInt *)&buffer,(uVar11 * -0x89 + 0x88) / 0x3b + uVar5,5,false);
    while( true ) {
      if ((uVar12 & 1) != 0) {
        APInt::operator*=(&significand,(APInt *)&buffer);
      }
      if (uVar12 < 2) break;
      uVar12 = uVar12 >> 1;
      APInt::operator*=((APInt *)&buffer,(APInt *)&buffer);
    }
    APInt::~APInt((APInt *)&buffer);
    local_168 = (ulong)uVar11;
  }
  uVar11 = APInt::getActiveBits(&significand);
  uVar5 = ((int)uVar13 * 0xc4 + 0x3aU) / 0x3b;
  iVar7 = uVar11 - uVar5;
  if ((uVar5 <= uVar11 && iVar7 != 0) && (uVar11 = iVar7 * 0x3b, 0xc3 < uVar11)) {
    uVar13 = (ulong)uVar11 / 0xc4;
    APInt::APInt((APInt *)&buffer,significand.BitWidth,1,false);
    APInt::APInt(&powten,significand.BitWidth,10,false);
    iVar7 = (int)uVar13;
    while( true ) {
      if ((uVar13 & 1) != 0) {
        APInt::operator*=((APInt *)&buffer,&powten);
      }
      if ((uint)uVar13 < 2) break;
      uVar13 = (ulong)((uint)uVar13 >> 1);
      APInt::operator*=(&powten,&powten);
    }
    APInt::udiv(&ten,&significand);
    APInt::operator=(&significand,&ten);
    APInt::~APInt(&ten);
    APInt::getActiveBits(&significand);
    APInt::trunc(&ten,__x);
    APInt::operator=(&significand,&ten);
    APInt::~APInt(&ten);
    APInt::~APInt(&powten);
    APInt::~APInt((APInt *)&buffer);
    local_168 = (ulong)(uint)(iVar7 + (int)local_168);
  }
  buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX =
       &buffer.super_SmallVectorStorage<char,_256U>;
  buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
  buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity = 0x100;
  APInt::APInt(&ten,significand.BitWidth,10,false);
  APInt::APInt(&digit,significand.BitWidth,0,false);
  uVar13 = (ulong)(uint)((int)local_180 - (int)local_168);
  bVar17 = true;
  while( true ) {
    bVar4 = APInt::operator!=(&significand,0);
    pSVar3 = local_188;
    if (!bVar4) break;
    APInt::udivrem(&significand,&ten,&significand,&digit);
    uVar6 = APInt::getZExtValue(&digit);
    bVar17 = (bool)(bVar17 & (int)uVar6 == 0);
    if (bVar17) {
      local_168 = (ulong)((int)local_168 + 1);
      uVar13 = uVar13 - 1;
    }
    else {
      powten.U.VAL._0_1_ = (char)uVar6 + '0';
      SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)&buffer,(char *)&powten);
    }
  }
  uVar11 = buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  uVar14 = buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff;
  if (uVar14 == 0) {
    __assert_fail("!buffer.empty() && \"no characters in buffer!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xdbd,
                  "void llvm::detail::IEEEFloat::toString(SmallVectorImpl<char> &, unsigned int, unsigned int, bool) const"
                 );
  }
  uVar12 = (uint)local_180;
  uVar5 = buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size - uVar12;
  if (uVar12 <= buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size && uVar5 != 0
     ) {
    if (buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <= uVar5 - 1)
    goto LAB_0016200a;
    uVar10 = (ulong)uVar5;
    if (*(char *)((long)buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>
                        .super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                 (ulong)(uVar5 - 1)) < '5') {
      for (; uVar14 != uVar10; uVar10 = uVar10 + 1) {
        if (*(char *)((long)buffer.super_SmallVectorImpl<char>.
                            super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                     + uVar10) != '0') {
          if ((uint)uVar10 <
              buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size) {
            uVar14 = (ulong)(buffer.super_SmallVectorImpl<char>.
                             super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
                            - (int)uVar13);
            uVar10 = uVar10 & 0xffffffff;
            goto LAB_00161d00;
          }
          break;
        }
        uVar13 = uVar13 - 1;
      }
      goto LAB_0016200a;
    }
LAB_00161c3d:
    if (uVar14 != uVar10) {
      if (*(char *)((long)buffer.super_SmallVectorImpl<char>.
                          super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                   uVar10) == '9') goto code_r0x00161c4d;
      *(char *)((long)buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
               uVar10) =
           *(char *)((long)buffer.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                    + uVar10) + '\x01';
      if ((buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0) &&
         ((uint)uVar10 <
          buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size)) {
        uVar14 = uVar14 - uVar13;
LAB_00161d00:
        SmallVectorImpl<char>::erase
                  (&buffer.super_SmallVectorImpl<char>,
                   (const_iterator)
                   buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                   (const_iterator)
                   (uVar10 + (long)buffer.super_SmallVectorImpl<char>.
                                   super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX));
        local_168 = uVar14 & 0xffffffff;
        goto LAB_00161d08;
      }
      goto LAB_0016200a;
    }
    buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ =
         buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
         0xffffffff00000000;
    local_168 = (ulong)((int)local_168 + uVar11);
    powten.U.VAL._0_1_ = 0x31;
    SmallVectorTemplateBase<char,_true>::push_back
              ((SmallVectorTemplateBase<char,_true> *)&buffer,(char *)&powten);
LAB_00161d08:
    uVar14 = buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff;
  }
  uVar11 = (uint)local_168;
  uVar5 = (uint)uVar14;
  if (local_1a8 != 0) {
    if ((int)uVar11 < 0) {
      uVar12 = uVar5 + uVar11;
      if (1 - uVar12 <= local_1a8 || -1 < (int)(uVar12 - 1)) {
        if ((int)uVar12 < 1) {
          powten.U.VAL._0_1_ = 0x30;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar3->super_SmallVectorTemplateBase<char,_true>,(char *)&powten);
          powten.U.VAL._0_1_ = 0x2e;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar3->super_SmallVectorTemplateBase<char,_true>,(char *)&powten);
          for (; uVar12 != 0; uVar12 = uVar12 + 1) {
            powten.U.VAL._0_1_ = 0x30;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&pSVar3->super_SmallVectorTemplateBase<char,_true>,(char *)&powten);
          }
          uVar12 = 0;
        }
        else {
          uVar13 = (ulong)uVar12;
          uVar11 = uVar5;
          while( true ) {
            uVar11 = uVar11 - 1;
            bVar17 = uVar13 == 0;
            uVar13 = uVar13 - 1;
            if (bVar17) break;
            if (buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <= uVar11)
            goto LAB_0016200a;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&pSVar3->super_SmallVectorTemplateBase<char,_true>,
                       (char *)((ulong)uVar11 +
                               (long)buffer.super_SmallVectorImpl<char>.
                                     super_SmallVectorTemplateBase<char,_true>.
                                     super_SmallVectorTemplateCommon<char,_void>.
                                     super_SmallVectorBase.BeginX));
          }
          powten.U.VAL._0_1_ = 0x2e;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar3->super_SmallVectorTemplateBase<char,_true>,(char *)&powten);
        }
        for (uVar5 = ~uVar12 + uVar5; uVar5 != 0xffffffff; uVar5 = uVar5 - 1) {
          if (buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <= uVar5)
          goto LAB_0016200a;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar3->super_SmallVectorTemplateBase<char,_true>,
                     (char *)((ulong)uVar5 +
                             (long)buffer.super_SmallVectorImpl<char>.
                                   super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX));
        }
        goto LAB_00161ed5;
      }
    }
    else if ((uVar11 <= local_1a8) && (uVar5 + uVar11 <= uVar12)) {
      while (uVar14 != 0) {
        uVar14 = uVar14 - 1;
        if (buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <= (uint)uVar14)
        goto LAB_0016200a;
        SmallVectorTemplateBase<char,_true>::push_back
                  (&pSVar3->super_SmallVectorTemplateBase<char,_true>,
                   (char *)((uVar14 & 0xffffffff) +
                           (long)buffer.super_SmallVectorImpl<char>.
                                 super_SmallVectorTemplateBase<char,_true>.
                                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                 BeginX));
      }
      while (iVar7 = (int)local_168, local_168 = (ulong)(iVar7 - 1), iVar7 != 0) {
        powten.U.VAL._0_1_ = 0x30;
        SmallVectorTemplateBase<char,_true>::push_back
                  (&pSVar3->super_SmallVectorTemplateBase<char,_true>,(char *)&powten);
      }
      goto LAB_00161ed5;
    }
  }
  if (uVar5 == 0) {
LAB_0016200a:
    __assert_fail("idx < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x9b,
                  "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                 );
  }
  SmallVectorTemplateBase<char,_true>::push_back
            (&pSVar3->super_SmallVectorTemplateBase<char,_true>,
             (char *)((ulong)(uVar5 - 1) +
                     (long)buffer.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
            );
  powten.U.VAL._0_1_ = 0x2e;
  SmallVectorTemplateBase<char,_true>::push_back
            (&pSVar3->super_SmallVectorTemplateBase<char,_true>,(char *)&powten);
  if (((byte)local_1a4 & uVar5 == 1) == 0) {
    for (; uVar14 != 1; uVar14 = uVar14 - 1) {
      if (buffer.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <=
          (uint)(uVar14 - 2)) goto LAB_0016200a;
      SmallVectorTemplateBase<char,_true>::push_back
                (&pSVar3->super_SmallVectorTemplateBase<char,_true>,
                 (char *)((uVar14 - 2 & 0xffffffff) +
                         (long)buffer.super_SmallVectorImpl<char>.
                               super_SmallVectorTemplateBase<char,_true>.
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               BeginX));
    }
  }
  else {
    powten.U.VAL._0_1_ = 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              (&pSVar3->super_SmallVectorTemplateBase<char,_true>,(char *)&powten);
  }
  uVar11 = (uVar5 + uVar11) - 1;
  uVar15 = 0x45;
  if ((byte)local_1a4 == '\0') {
    uVar15 = 0x65;
    if (uVar5 - 1 < (uint)local_180) {
      powten.U.VAL._0_1_ = 0x30;
      SmallVectorImpl<char>::append
                (local_188,(ulong)(((uint)local_180 - uVar5) + 1),(char *)&powten);
    }
  }
  pSVar3 = local_188;
  powten.U.VAL._0_1_ = uVar15;
  SmallVectorTemplateBase<char,_true>::push_back
            (&local_188->super_SmallVectorTemplateBase<char,_true>,(char *)&powten);
  powten.U.VAL._0_1_ = (char)((int)uVar11 >> 0x1f) * -2 + '+';
  SmallVectorTemplateBase<char,_true>::push_back
            (&pSVar3->super_SmallVectorTemplateBase<char,_true>,(char *)&powten);
  uVar5 = -uVar11;
  if (0 < (int)uVar11) {
    uVar5 = uVar11;
  }
  powten.U.pVal = (uint64_t *)local_190;
  powten.BitWidth = 0;
  powten._12_4_ = 6;
  do {
    local_1a9 = (byte)((ulong)uVar5 % 10) | 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              ((SmallVectorTemplateBase<char,_true> *)&powten,(char *)&local_1a9);
    bVar17 = 9 < uVar5;
    uVar5 = uVar5 / 10;
  } while (bVar17);
  if ((char)local_1a4 == '\0' && powten.BitWidth < 2) {
    local_1a9 = 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              ((SmallVectorTemplateBase<char,_true> *)&powten,(char *)&local_1a9);
  }
  pSVar3 = local_188;
  uVar13 = (ulong)powten.BitWidth;
  while (uVar13 != 0) {
    uVar13 = uVar13 - 1;
    if (powten.BitWidth <= (uint)uVar13) goto LAB_0016200a;
    SmallVectorTemplateBase<char,_true>::push_back
              (&pSVar3->super_SmallVectorTemplateBase<char,_true>,
               (char *)((uVar13 & 0xffffffff) + (long)powten.U.pVal));
  }
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&powten);
LAB_00161ed5:
  APInt::~APInt(&digit);
  APInt::~APInt(&ten);
  SmallVectorImpl<char>::~SmallVectorImpl(&buffer.super_SmallVectorImpl<char>);
  APInt::~APInt(&significand);
  return;
code_r0x00161c4d:
  uVar10 = uVar10 + 1;
  uVar13 = uVar13 - 1;
  goto LAB_00161c3d;
}

Assistant:

void IEEEFloat::toString(SmallVectorImpl<char> &Str, unsigned FormatPrecision,
                         unsigned FormatMaxPadding, bool TruncateZero) const {
  switch (category) {
  case fcInfinity:
    if (isNegative())
      return append(Str, "-Inf");
    else
      return append(Str, "+Inf");

  case fcNaN: return append(Str, "NaN");

  case fcZero:
    if (isNegative())
      Str.push_back('-');

    if (!FormatMaxPadding) {
      if (TruncateZero)
        append(Str, "0.0E+0");
      else {
        append(Str, "0.0");
        if (FormatPrecision > 1)
          Str.append(FormatPrecision - 1, '0');
        append(Str, "e+00");
      }
    } else
      Str.push_back('0');
    return;

  case fcNormal:
    break;
  }

  if (isNegative())
    Str.push_back('-');

  // Decompose the number into an APInt and an exponent.
  int exp = exponent - ((int) semantics->precision - 1);
  APInt significand(semantics->precision,
                    makeArrayRef(significandParts(),
                                 partCountForBits(semantics->precision)));

  // Set FormatPrecision if zero.  We want to do this before we
  // truncate trailing zeros, as those are part of the precision.
  if (!FormatPrecision) {
    // We use enough digits so the number can be round-tripped back to an
    // APFloat. The formula comes from "How to Print Floating-Point Numbers
    // Accurately" by Steele and White.
    // FIXME: Using a formula based purely on the precision is conservative;
    // we can print fewer digits depending on the actual value being printed.

    // FormatPrecision = 2 + floor(significandBits / lg_2(10))
    FormatPrecision = 2 + semantics->precision * 59 / 196;
  }

  // Ignore trailing binary zeros.
  int trailingZeros = significand.countTrailingZeros();
  exp += trailingZeros;
  significand.lshrInPlace(trailingZeros);

  // Change the exponent from 2^e to 10^e.
  if (exp == 0) {
    // Nothing to do.
  } else if (exp > 0) {
    // Just shift left.
    significand = significand.zext(semantics->precision + exp);
    significand <<= exp;
    exp = 0;
  } else { /* exp < 0 */
    int texp = -exp;

    // We transform this using the identity:
    //   (N)(2^-e) == (N)(5^e)(10^-e)
    // This means we have to multiply N (the significand) by 5^e.
    // To avoid overflow, we have to operate on numbers large
    // enough to store N * 5^e:
    //   log2(N * 5^e) == log2(N) + e * log2(5)
    //                 <= semantics->precision + e * 137 / 59
    //   (log_2(5) ~ 2.321928 < 2.322034 ~ 137/59)

    unsigned precision = semantics->precision + (137 * texp + 136) / 59;

    // Multiply significand by 5^e.
    //   N * 5^0101 == N * 5^(1*1) * 5^(0*2) * 5^(1*4) * 5^(0*8)
    significand = significand.zext(precision);
    APInt five_to_the_i(precision, 5);
    while (true) {
      if (texp & 1) significand *= five_to_the_i;

      texp >>= 1;
      if (!texp) break;
      five_to_the_i *= five_to_the_i;
    }
  }

  AdjustToPrecision(significand, exp, FormatPrecision);

  SmallVector<char, 256> buffer;

  // Fill the buffer.
  unsigned precision = significand.getBitWidth();
  APInt ten(precision, 10);
  APInt digit(precision, 0);

  bool inTrail = true;
  while (significand != 0) {
    // digit <- significand % 10
    // significand <- significand / 10
    APInt::udivrem(significand, ten, significand, digit);

    unsigned d = digit.getZExtValue();

    // Drop trailing zeros.
    if (inTrail && !d) exp++;
    else {
      buffer.push_back((char) ('0' + d));
      inTrail = false;
    }
  }

  assert(!buffer.empty() && "no characters in buffer!");

  // Drop down to FormatPrecision.
  // TODO: don't do more precise calculations above than are required.
  AdjustToPrecision(buffer, exp, FormatPrecision);

  unsigned NDigits = buffer.size();

  // Check whether we should use scientific notation.
  bool FormatScientific;
  if (!FormatMaxPadding)
    FormatScientific = true;
  else {
    if (exp >= 0) {
      // 765e3 --> 765000
      //              ^^^
      // But we shouldn't make the number look more precise than it is.
      FormatScientific = ((unsigned) exp > FormatMaxPadding ||
                          NDigits + (unsigned) exp > FormatPrecision);
    } else {
      // Power of the most significant digit.
      int MSD = exp + (int) (NDigits - 1);
      if (MSD >= 0) {
        // 765e-2 == 7.65
        FormatScientific = false;
      } else {
        // 765e-5 == 0.00765
        //           ^ ^^
        FormatScientific = ((unsigned) -MSD) > FormatMaxPadding;
      }
    }
  }

  // Scientific formatting is pretty straightforward.
  if (FormatScientific) {
    exp += (NDigits - 1);

    Str.push_back(buffer[NDigits-1]);
    Str.push_back('.');
    if (NDigits == 1 && TruncateZero)
      Str.push_back('0');
    else
      for (unsigned I = 1; I != NDigits; ++I)
        Str.push_back(buffer[NDigits-1-I]);
    // Fill with zeros up to FormatPrecision.
    if (!TruncateZero && FormatPrecision > NDigits - 1)
      Str.append(FormatPrecision - NDigits + 1, '0');
    // For !TruncateZero we use lower 'e'.
    Str.push_back(TruncateZero ? 'E' : 'e');

    Str.push_back(exp >= 0 ? '+' : '-');
    if (exp < 0) exp = -exp;
    SmallVector<char, 6> expbuf;
    do {
      expbuf.push_back((char) ('0' + (exp % 10)));
      exp /= 10;
    } while (exp);
    // Exponent always at least two digits if we do not truncate zeros.
    if (!TruncateZero && expbuf.size() < 2)
      expbuf.push_back('0');
    for (unsigned I = 0, E = expbuf.size(); I != E; ++I)
      Str.push_back(expbuf[E-1-I]);
    return;
  }

  // Non-scientific, positive exponents.
  if (exp >= 0) {
    for (unsigned I = 0; I != NDigits; ++I)
      Str.push_back(buffer[NDigits-1-I]);
    for (unsigned I = 0; I != (unsigned) exp; ++I)
      Str.push_back('0');
    return;
  }

  // Non-scientific, negative exponents.

  // The number of digits to the left of the decimal point.
  int NWholeDigits = exp + (int) NDigits;

  unsigned I = 0;
  if (NWholeDigits > 0) {
    for (; I != (unsigned) NWholeDigits; ++I)
      Str.push_back(buffer[NDigits-I-1]);
    Str.push_back('.');
  } else {
    unsigned NZeros = 1 + (unsigned) -NWholeDigits;

    Str.push_back('0');
    Str.push_back('.');
    for (unsigned Z = 1; Z != NZeros; ++Z)
      Str.push_back('0');
  }

  for (; I != NDigits; ++I)
    Str.push_back(buffer[NDigits-I-1]);
}